

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::FixedArray<char,1ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,FixedArray<char,_1UL> *params_2)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  StringTree *pSVar3;
  FixedArray<char,_1UL> *pFVar4;
  char *pos;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  _ *local_d0;
  undefined8 local_c8;
  Array<kj::StringTree::Branch> local_c0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  _ *local_80;
  undefined8 local_78;
  String local_70;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  _ *local_40;
  undefined8 local_38;
  undefined1 local_29;
  StringTree *local_28;
  FixedArray<char,_1UL> *params_local_2;
  StringTree *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_29 = 0;
  local_28 = params_1;
  params_local_2 = (FixedArray<char,_1UL> *)params;
  params_local_1 = this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_58 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_1);
  local_50 = size((StringTree *)params_local_2);
  local_48 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)local_28);
  local_40 = (_ *)&local_58;
  local_38 = 3;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x3;
  sVar1 = kj::_::sum(local_40,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  local_98 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  local_90 = flatSize(pSVar3);
  pFVar4 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)local_28);
  local_88 = flatSize<kj::FixedArray<char,1ul>>(pFVar4);
  local_80 = (_ *)&local_98;
  local_78 = 3;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x3;
  sVar1 = kj::_::sum(local_80,nums_00);
  heapString(&local_70,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_70);
  String::~String(&local_70);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  local_e8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  local_e0 = branchCount(pSVar3);
  pFVar4 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)local_28);
  local_d8 = branchCount<kj::FixedArray<char,1ul>>(pFVar4);
  local_d0 = (_ *)&local_e8;
  local_c8 = 3;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x3;
  sVar1 = kj::_::sum(local_d0,nums_01);
  heapArray<kj::StringTree::Branch>(&local_c0,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_c0);
  Array<kj::StringTree::Branch>::~Array(&local_c0);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  pFVar4 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)local_28);
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,pos,0,pAVar2,pSVar3,pFVar4);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}